

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-spell.c
# Opt level: O1

void unset_spells(bitflag *spells,bitflag *flags,bitflag *pflags,element_info *el,
                 monster_conflict *mon)

{
  mon_spell_info *pmVar1;
  effect *peVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  _Bool _Var6;
  _Bool _Var7;
  ushort uVar8;
  uint32_t uVar9;
  uint uVar10;
  int iVar11;
  timed_failure *ptVar12;
  size_t size;
  bitflag *flags_00;
  mon_spell_info *pmVar13;
  monster_spell **ppmVar14;
  bitflag backup [13];
  int local_64;
  bitflag local_3d [13];
  
  _Var6 = monster_is_smart((monster *)mon);
  flag_wipe(local_3d,0xd);
  local_64 = 100;
  pmVar13 = mon_spell_types;
  uVar8 = 0;
  do {
    ppmVar14 = &monster_spells;
    do {
      ppmVar14 = &((monster_spell *)ppmVar14)->next->next;
      if ((monster_spell *)ppmVar14 == (monster_spell *)0x0) goto LAB_0018428a;
    } while (((monster_spell *)ppmVar14)->index != uVar8);
    if ((monster_spell *)ppmVar14 != (monster_spell *)0x0) {
      uVar10 = (uint)uVar8;
      _Var7 = flag_has_dbg(spells,0xd,uVar10,"spells","info->index");
      if (_Var7) {
        peVar2 = ((monster_spell *)ppmVar14)->effect;
        if ((pmVar13->type & 7) == 0) {
          for (; peVar2 != (effect *)0x0; peVar2 = peVar2->next) {
            if (((_Var6) || (uVar9 = Rand_div(3), uVar9 != 0)) && (peVar2->index == 10)) {
              if (0x34 < (ulong)(uint)peVar2->subtype) {
                __assert_fail("effect->subtype >= 0 && effect->subtype < TMD_MAX",
                              "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-spell.c"
                              ,0x205,
                              "void unset_spells(bitflag *, bitflag *, bitflag *, struct element_info *, const struct monster *)"
                             );
              }
              ptVar12 = timed_effects[(uint)peVar2->subtype].fail;
              if (ptVar12 != (timed_failure *)0x0) {
                bVar4 = false;
                do {
                  bVar3 = bVar4;
                  switch(ptVar12->code) {
                  case 1:
                    iVar11 = ptVar12->idx;
                    size = 6;
                    pcVar5 = "save str flags";
                    flags_00 = flags;
                    goto LAB_001841c0;
                  case 2:
                    if (el[ptVar12->idx].res_level < 0x51) {
                      bVar3 = true;
                    }
                    break;
                  case 3:
                    if (100 < el[ptVar12->idx].res_level) {
                      bVar3 = true;
                    }
                    break;
                  case 4:
                    iVar11 = ptVar12->idx;
                    size = 10;
                    pcVar5 = "p->state.pflags";
                    flags_00 = pflags;
LAB_001841c0:
                    _Var7 = flag_has_dbg(flags_00,size,iVar11,pcVar5 + 9,"f->idx");
                    bVar3 = true;
                    if (!_Var7) {
                      bVar3 = bVar4;
                    }
                  }
                  ptVar12 = ptVar12->next;
                } while ((ptVar12 != (timed_failure *)0x0) && (bVar4 = bVar3, !bVar3));
                if (bVar3) goto LAB_00184279;
              }
            }
            if (((_Var6) || (uVar9 = Rand_div(2), uVar9 == 0)) &&
               ((peVar2->index == 0x17 &&
                (_Var7 = flag_has_dbg(pflags,10,0x1d,"pflags","PF_NO_MANA"), _Var7))))
            goto LAB_00184279;
          }
        }
        else {
          iVar11 = 100 - el[peVar2->subtype].res_level;
          if (iVar11 <= local_64 && _Var6) {
            flag_on_dbg(local_3d,0xd,uVar10,"backup","info->index");
            local_64 = iVar11;
          }
          uVar9 = Rand_div(100);
          if ((int)uVar9 < iVar11) {
LAB_00184279:
            flag_off(spells,0xd,uVar10);
          }
        }
      }
    }
LAB_0018428a:
    uVar8 = pmVar13[1].index;
    pmVar13 = pmVar13 + 1;
  } while (uVar8 < 0x61);
  iVar11 = flag_count(spells,0xd);
  if ((_Var6) && (uVar9 = Rand_div(iVar11 + 1), uVar9 == 0)) {
    pmVar13 = mon_spell_types;
    uVar10 = 0;
    do {
      ppmVar14 = &monster_spells;
      do {
        ppmVar14 = &((monster_spell *)ppmVar14)->next->next;
        if ((monster_spell *)ppmVar14 == (monster_spell *)0x0) goto LAB_0018434b;
      } while (((monster_spell *)ppmVar14)->index != (uint16_t)uVar10);
      if ((((monster_spell *)ppmVar14 != (monster_spell *)0x0) &&
          (_Var6 = flag_has_dbg(local_3d,0xd,uVar10,"backup","info->index"), _Var6)) &&
         (100 - el[((monster_spell *)ppmVar14)->effect->subtype].res_level == local_64)) {
        flag_on_dbg(spells,0xd,uVar10,"spells","info->index");
      }
LAB_0018434b:
      pmVar1 = pmVar13 + 1;
      uVar10 = (uint)pmVar1->index;
      pmVar13 = pmVar13 + 1;
    } while (pmVar1->index < 0x61);
  }
  return;
}

Assistant:

void unset_spells(bitflag *spells, bitflag *flags, bitflag *pflags,
				  struct element_info *el, const struct monster *mon)
{
	const struct mon_spell_info *info;
	bool smart = monster_is_smart(mon);
	int lowest_resist = RES_LEVEL_BASE;
	bitflag backup[RSF_SIZE];
	int restore_chance = 0;

	rsf_wipe(backup);

	for (info = mon_spell_types; info->index < RSF_MAX; info++) {
		const struct monster_spell *spell = monster_spell_by_index(info->index);
		const struct effect *effect;

		/* Ignore missing spells */
		if (!spell) continue;
		if (!rsf_has(spells, info->index)) continue;

		/* Get the effect */
		effect = spell->effect;

		/* First we test the elemental spells */
		if (info->type & (RST_BOLT | RST_BALL | RST_BREATH)) {
			int element = effect->subtype;
			int raw_resist = RES_LEVEL_BASE - el[element].res_level;

			/* Smart monsters keep a backup */
			if (smart && (raw_resist <= lowest_resist)) {
				lowest_resist = raw_resist;
				rsf_on(backup, info->index);
			}

			/* High resist means more likely to drop the spell */
			if (randint0(100) < raw_resist) {
				rsf_off(spells, info->index);
			}
		} else {
			/* Now others with resisted effects */
			while (effect) {
				/* Timed effects */
				if ((smart || !one_in_(3))
						&& effect->index == EF_TIMED_INC) {
					const struct timed_failure *f;
					bool resisted = false;

					assert(effect->subtype >= 0
						&& effect->subtype < TMD_MAX);
					for (f = timed_effects[effect->subtype].fail;
							f && !resisted;
							f = f->next) {
						switch (f->code) {
						case TMD_FAIL_FLAG_OBJECT:
							if (of_has(flags, f->idx)) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_RESIST:
							if (el[f->idx].res_level <= RES_LEVEL_EFFECT) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_VULN:
							if (el[f->idx].res_level > RES_LEVEL_BASE) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_PLAYER:
							if (pf_has(pflags, f->idx)) {
								resisted = true;
							}
							break;

						/*
						 * The monster doesn't track
						 * the timed effects present
						 * on the player so do
						 * nothing with resistances
						 * due to those.
						 */
						case TMD_FAIL_FLAG_TIMED_EFFECT:
							break;
						}
					}
					if (resisted) {
						break;
					}
				}

				/* Mana drain */
				if ((smart || one_in_(2)) &&
						effect->index == EF_DRAIN_MANA &&
						pf_has(pflags, PF_NO_MANA))
					break;

				effect = effect->next;
			}
			if (effect)
				rsf_off(spells, info->index);
		}
	}

	/* Smart monsters re-assess dropped elemental spells */
	restore_chance = 1 + rsf_count(spells);
	if (smart && one_in_(restore_chance)) {
		for (info = mon_spell_types; info->index < RSF_MAX; info++) {
			const struct monster_spell *spell =
				monster_spell_by_index(info->index);
			int element;
			if (!spell) continue;
			if (!rsf_has(backup, info->index)) continue;
			element = spell->effect->subtype;
			if (RES_LEVEL_BASE - el[element].res_level == lowest_resist) {
				rsf_on(spells, info->index);
			}
		}
	}
}